

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

int __thiscall
Validate::CheckIDDoesNotExceedMaxLimit(Validate *this,char *idName,longlong initialID)

{
  OASIS_FLOAT *pOVar1;
  OASIS_FLOAT *pOVar2;
  OASIS_FLOAT *pOVar3;
  int iVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  char *pcVar5;
  long extraout_RDX;
  int *piVar6;
  
  if ((initialID < 0x80000000) && (this->MIN_ID_ <= initialID)) {
    return (int)initialID;
  }
  CheckIDDoesNotExceedMaxLimit();
  if (0xffffffff00000000 < extraout_RDX - 0x100000000U) {
    return (int)extraout_RDX;
  }
  CheckIDDoesNotExceedMaxLimit();
  pcVar5 = fgets(this->line_,0x1000,_stdin);
  if (pcVar5 != (char *)0x0) {
    pOVar1 = &(((ValidateDamageBin *)this)->dbd_).bin_from;
    pOVar2 = &(((ValidateDamageBin *)this)->dbd_).bin_to;
    pOVar3 = &(((ValidateDamageBin *)this)->dbd_).interpolation;
    piVar6 = &(((ValidateDamageBin *)this)->dbd_).interval_type;
    iVar4 = __isoc99_sscanf(this,"%d,%f,%f,%f,%d",&((ValidateDamageBin *)this)->dbd_,pOVar1,pOVar2,
                            pOVar3,piVar6);
    if (iVar4 == 5) {
      ValidateDamageBin::CheckFormat((ValidateDamageBin *)this);
      return extraout_EAX;
    }
    iVar4 = __isoc99_sscanf(this,"%d,%f,%f,%f",&((ValidateDamageBin *)this)->dbd_,pOVar1,pOVar2,
                            pOVar3,piVar6);
    if (iVar4 == 4) {
      (((ValidateDamageBin *)this)->dbd_).interval_type = 0;
      ((ValidateDamageBin *)this)->newFormat_ = true;
      return 4;
    }
    ValidateDamageBin::CheckFormat((ValidateDamageBin *)this);
  }
  ValidateDamageBin::CheckFormat((ValidateDamageBin *)this);
  return extraout_EAX_00;
}

Assistant:

int Validate::CheckIDDoesNotExceedMaxLimit(char *idName, long long initialID) {
/* Check ID does not exceed maximum value for integers. */

  if (initialID < MIN_ID_ || initialID > INT_MAX) {

    fprintf(stderr, "ERROR: %s ID %lld on line %d does not lie within"
		    " permitted range [%d, %d]. Please reassign %s IDs to lie"
		    " within this range.\n",
		    idName, initialID, lineno_, MIN_ID_, INT_MAX, idName);
    PrintErrorMessage();

  }

  return (int)initialID;

}